

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbiftad.cpp
# Opt level: O2

void __thiscall RandStrParser::exec(RandStrParser *this,vm_val_t *result)

{
  uint uVar1;
  vm_obj_id_t vVar2;
  wchar_t *str;
  ulong uVar3;
  wchar_t *dst;
  
  uVar1 = (*this->tree->_vptr_RandStrNode[2])();
  if (uVar1 == 0) {
    vVar2 = CVmObjString::create(0,0);
    result->typ = VM_OBJ;
    (result->val).obj = vVar2;
  }
  else {
    uVar3 = 0xffffffffffffffff;
    if (-1 < (int)uVar1) {
      uVar3 = (ulong)uVar1 << 2;
    }
    str = (wchar_t *)operator_new__(uVar3);
    dst = str;
    (*this->tree->_vptr_RandStrNode[3])(this->tree,&dst);
    vVar2 = CVmObjString::create(0,str,(long)dst - (long)str >> 2);
    result->typ = VM_OBJ;
    (result->val).obj = vVar2;
    operator_delete__(str);
  }
  return;
}

Assistant:

void RandStrParser::exec(VMG_ vm_val_t *result)
{
    /* calculate the maximum length of the result */
    size_t len = tree->maxlen();

    /* if the maximum length is zero, just return an empty string */
    if (len == 0)
    {
        result->set_obj(CVmObjString::create(vmg_ FALSE, 0));
        return;
    }

    /* allocate a wchar_t buffer of the maximum length */
    wchar_t *buf = new wchar_t[len];

    /* generate the string */
    wchar_t *dst = buf;
    tree->generate(vmg_ dst);

    /* build the return string */
    result->set_obj(CVmObjString::create(vmg_ FALSE, buf, dst - buf));

    /* done with the temporary buffer */
    delete [] buf;
}